

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::internal::TracingMuxerImpl::InitializeConsumer
          (TracingMuxerImpl *this,TracingSessionGlobalID session_id)

{
  pointer pRVar1;
  ConsumerEndpoint *pCVar2;
  _Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false> _Var3;
  ConsumerImpl *pCVar4;
  ulong uVar5;
  TracingMuxerImpl *pTVar6;
  ConnectConsumerArgs conn_args;
  _Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false> local_30;
  ConsumerImpl *local_28;
  TaskRunner *pTStack_20;
  
  pTVar6 = this;
  pCVar4 = FindConsumer(this,session_id);
  if (pCVar4 != (ConsumerImpl *)0x0) {
    pRVar1 = (this->backends_).
             super__Vector_base<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->backends_).
                   super__Vector_base<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 4) *
            0x6db6db6db6db6db7;
    if (uVar5 <= pCVar4->backend_id_) {
      InitializeConsumer();
      LOCK();
      (pTVar6->max_producer_reconnections_).super___atomic_base<unsigned_int>._M_i =
           (__int_type_conflict)uVar5;
      UNLOCK();
      return;
    }
    pTStack_20 = (this->task_runner_)._M_t.
                 super___uniq_ptr_impl<perfetto::base::TaskRunner,_std::default_delete<perfetto::base::TaskRunner>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_perfetto::base::TaskRunner_*,_std::default_delete<perfetto::base::TaskRunner>_>
                 .super__Head_base<0UL,_perfetto::base::TaskRunner_*,_false>._M_head_impl;
    local_28 = pCVar4;
    (*(pRVar1[pCVar4->backend_id_].backend)->_vptr_TracingBackend[3])(&local_30);
    _Var3._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (ConsumerEndpoint *)0x0;
    pCVar2 = (pCVar4->service_)._M_t.
             super___uniq_ptr_impl<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::ConsumerEndpoint_*,_std::default_delete<perfetto::ConsumerEndpoint>_>
             .super__Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false>._M_head_impl;
    (pCVar4->service_)._M_t.
    super___uniq_ptr_impl<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
    ._M_t.
    super__Tuple_impl<0UL,_perfetto::ConsumerEndpoint_*,_std::default_delete<perfetto::ConsumerEndpoint>_>
    .super__Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (pCVar2 != (ConsumerEndpoint *)0x0) {
      (*pCVar2->_vptr_ConsumerEndpoint[1])();
    }
    if (local_30._M_head_impl != (ConsumerEndpoint *)0x0) {
      (*(local_30._M_head_impl)->_vptr_ConsumerEndpoint[1])();
    }
  }
  return;
}

Assistant:

void TracingMuxerImpl::InitializeConsumer(TracingSessionGlobalID session_id) {
  PERFETTO_DCHECK_THREAD(thread_checker_);

  auto* consumer = FindConsumer(session_id);
  if (!consumer)
    return;

  TracingBackendId backend_id = consumer->backend_id_;
  // |backends_| is append-only, Backend instances are always valid.
  PERFETTO_CHECK(backend_id < backends_.size());
  RegisteredBackend& backend = backends_[backend_id];

  TracingBackend::ConnectConsumerArgs conn_args;
  conn_args.consumer = consumer;
  conn_args.task_runner = task_runner_.get();
  consumer->Initialize(backend.backend->ConnectConsumer(conn_args));
}